

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

bool image_match::check_magic_number(path *filepath)

{
  pointer pcVar1;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  undefined8 this;
  int iVar2;
  long *plVar3;
  bool bVar4;
  uint8_t buff [8];
  ifstream input_file;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  char local_270;
  char cStack_26f;
  char cStack_26e;
  undefined5 uStack_26d;
  basic_string_view<char> local_268;
  undefined8 local_258;
  basic_string_view<char> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  byte abStack_218 [488];
  
  if ((spdlog::details::registry::instance()::s_instance == '\0') &&
     (iVar2 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance), iVar2 != 0))
  {
    spdlog::details::registry::registry
              ((registry *)spdlog::details::registry::instance()::s_instance);
    __cxa_atexit(spdlog::details::registry::~registry,
                 spdlog::details::registry::instance()::s_instance,&__dso_handle);
    __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
  }
  this = spdlog::details::registry::instance()::s_instance._280_8_;
  pcVar1 = (filepath->_M_pathname)._M_dataplus._M_p;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,pcVar1,pcVar1 + (filepath->_M_pathname)._M_string_length);
  local_290._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
  ;
  local_290._8_4_ = 0x76;
  local_280._M_allocated_capacity = 0x179acc;
  local_268.data_ = "Checking magic number for {}";
  local_268.size_ = 0x1c;
  loc._12_4_ = local_290._12_4_;
  loc.line = 0x76;
  loc.filename = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
  ;
  loc.funcname = "check_magic_number";
  spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
            ((logger *)this,loc,debug,&local_268,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::ifstream(&local_238,(filepath->_M_pathname)._M_dataplus._M_p,_S_bin);
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
    plVar3 = (long *)std::istream::read((char *)&local_238,(long)&local_270);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      pcVar1 = (filepath->_M_pathname)._M_dataplus._M_p;
      local_290._0_8_ = &local_280;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_290,pcVar1,pcVar1 + (filepath->_M_pathname)._M_string_length);
      if ((spdlog::details::registry::instance()::s_instance == '\0') &&
         (iVar2 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance),
         iVar2 != 0)) {
        spdlog::details::registry::registry
                  ((registry *)spdlog::details::registry::instance()::s_instance);
        __cxa_atexit(spdlog::details::registry::~registry,
                     spdlog::details::registry::instance()::s_instance,&__dso_handle);
        __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
      }
      local_268.data_ = (char *)0x0;
      local_268.size_ = 0;
      local_258 = 0;
      local_248.data_ = "Could not read magic number for file {}";
      local_248.size_ = 0x27;
      loc_01.funcname = (char *)0x0;
      loc_01.filename = (char *)0x0;
      loc_01.line = 0;
      loc_01._12_4_ = 0;
      spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
                ((logger *)spdlog::details::registry::instance()::s_instance._280_8_,loc_01,warn,
                 &local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290);
      goto LAB_00159343;
    }
    if (local_270 == 'B') {
      if ((spdlog::details::registry::instance()::s_instance == '\0') &&
         (iVar2 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance),
         iVar2 != 0)) {
        spdlog::details::registry::registry
                  ((registry *)spdlog::details::registry::instance()::s_instance);
        __cxa_atexit(spdlog::details::registry::~registry,
                     spdlog::details::registry::instance()::s_instance,&__dso_handle);
        __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
      }
      local_290._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      local_290._8_4_ = 0x94;
      local_280._M_allocated_capacity = 0x179acc;
      spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._280_8_,
                          7.64137243893093e-318);
      bVar4 = cStack_26f == 'M';
      goto LAB_0015935c;
    }
    if (local_270 == -0x77) {
      if ((spdlog::details::registry::instance()::s_instance == '\0') &&
         (iVar2 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance),
         iVar2 != 0)) {
        spdlog::details::registry::registry
                  ((registry *)spdlog::details::registry::instance()::s_instance);
        __cxa_atexit(spdlog::details::registry::~registry,
                     spdlog::details::registry::instance()::s_instance,&__dso_handle);
        __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
      }
      local_290._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      local_290._8_4_ = 0x8d;
      local_280._M_allocated_capacity = 0x179acc;
      spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._280_8_,
                          7.64137243893093e-318);
      bVar4 = CONCAT53(uStack_26d,CONCAT12(cStack_26e,CONCAT11(cStack_26f,local_270))) ==
              0xa1a0a0d474e5089;
      goto LAB_0015935c;
    }
    if (local_270 == -1) {
      if ((spdlog::details::registry::instance()::s_instance == '\0') &&
         (iVar2 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance),
         iVar2 != 0)) {
        spdlog::details::registry::registry
                  ((registry *)spdlog::details::registry::instance()::s_instance);
        __cxa_atexit(spdlog::details::registry::~registry,
                     spdlog::details::registry::instance()::s_instance,&__dso_handle);
        __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
      }
      local_290._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      local_290._8_4_ = 0x88;
      local_280._M_allocated_capacity = 0x179acc;
      spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._280_8_,
                          7.64137243893093e-318);
      bVar4 = cStack_26e == -1 && CONCAT11(cStack_26f,local_270) == -0x2701;
      goto LAB_0015935c;
    }
    if ((spdlog::details::registry::instance()::s_instance == '\0') &&
       (iVar2 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance), iVar2 != 0)
       ) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
    local_290._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
    ;
    local_290._8_4_ = 0x98;
    local_280._M_allocated_capacity = 0x179acc;
    spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._280_8_,
                        7.64137243893093e-318);
  }
  else {
    pcVar1 = (filepath->_M_pathname)._M_dataplus._M_p;
    local_290._0_8_ = &local_280;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_290,pcVar1,pcVar1 + (filepath->_M_pathname)._M_string_length);
    if ((spdlog::details::registry::instance()::s_instance == '\0') &&
       (iVar2 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance), iVar2 != 0)
       ) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
    local_268.data_ = (char *)0x0;
    local_268.size_ = 0;
    local_258 = 0;
    local_248.data_ = "Could not open file {}";
    local_248.size_ = 0x16;
    loc_00.funcname = (char *)0x0;
    loc_00.filename = (char *)0x0;
    loc_00.line = 0;
    loc_00._12_4_ = 0;
    spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
              ((logger *)spdlog::details::registry::instance()::s_instance._280_8_,loc_00,warn,
               &local_248,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290);
LAB_00159343:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._0_8_ != &local_280) {
      operator_delete((void *)local_290._0_8_,(ulong)(local_280._M_allocated_capacity + 1));
    }
  }
  bVar4 = false;
LAB_0015935c:
  std::ifstream::~ifstream(&local_238);
  return bVar4;
}

Assistant:

bool
check_magic_number(const std::filesystem::path& filepath)
{
    SPDLOG_DEBUG("Checking magic number for {}", filepath.string());

    std::ifstream input_file(filepath, std::ios_base::binary);
    if (!input_file) {
        spdlog::warn("Could not open file {}", filepath.string());
        return false;
    }

    std::uint8_t buff[MAGIC_NUMBER_BYTES];
    if (!input_file.read(reinterpret_cast<char*>(buff), sizeof(buff))) {
        spdlog::warn("Could not read magic number for file {}",
                     filepath.string());
        return false;
    }

    // Compare magic number
    switch (buff[0]) {
        case static_cast<std::uint8_t>('\xFF'):
            SPDLOG_DEBUG("Found JPEG magic number.");
            return (!strncmp((const char*)buff, "\xFF\xD8\xFF", 3)) ? true
                                                                    : false;

        case static_cast<std::uint8_t>('\x89'):
            SPDLOG_DEBUG("Found PNG magic number.");
            return (!strncmp(
                     (const char*)buff, "\x89\x50\x4E\x47\x0D\x0A\x1A\x0A", 8))
                     ? true
                     : false;

        case 'B':
            SPDLOG_DEBUG("Found BMP magic number.");
            return ((buff[1] == 'M')) ? true : false;
    }

    SPDLOG_DEBUG("Magic number unsupported or invalid.");

    return false;
}